

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetJacTimes(void *arkode_mem,ARKLsJacTimesSetupFn jtsetup,ARKLsJacTimesVecFn jtimes)

{
  int iVar1;
  ARKRhsFn p_Var2;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x385;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x38e;
  }
  else {
    iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetJacTimes",&arkls_mem);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (arkls_mem->LS->ops->setatimes ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied ATimes routine";
      error_code = -3;
      iVar1 = 0x39a;
    }
    else {
      if (jtimes != (ARKLsJacTimesVecFn)0x0) {
        arkls_mem->jtimesDQ = 0;
        arkls_mem->jtsetup = jtsetup;
        arkls_mem->jtimes = jtimes;
        arkls_mem->Jt_data = *(void **)((long)arkode_mem + 0x10);
        return 0;
      }
      arkls_mem->jtimesDQ = 1;
      arkls_mem->jtsetup = (ARKLsJacTimesSetupFn)0x0;
      arkls_mem->jtimes = arkLsDQJtimes;
      arkls_mem->Jt_data = arkode_mem;
      p_Var2 = (ARKRhsFn)(**(code **)((long)arkode_mem + 0x148))(arkode_mem);
      arkls_mem->Jt_f = p_Var2;
      if (p_Var2 != (ARKRhsFn)0x0) {
        return 0;
      }
      msgfmt = "Time step module is missing implicit RHS fcn";
      error_code = -3;
      iVar1 = 0x3b2;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetJacTimes",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetJacTimes(void* arkode_mem, ARKLsJacTimesSetupFn jtsetup,
                      ARKLsJacTimesVecFn jtimes)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    arkls_mem->jtimesDQ = SUNFALSE;
    arkls_mem->jtsetup  = jtsetup;
    arkls_mem->jtimes   = jtimes;
    arkls_mem->Jt_data  = ark_mem->user_data;
  }
  else
  {
    arkls_mem->jtimesDQ = SUNTRUE;
    arkls_mem->jtsetup  = NULL;
    arkls_mem->jtimes   = arkLsDQJtimes;
    arkls_mem->Jt_data  = ark_mem;
    arkls_mem->Jt_f     = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}